

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalize.cpp
# Opt level: O3

int __thiscall ncnn::Normalize::forward(Normalize *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  int iVar2;
  uint _c;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  void *pvVar7;
  int iVar8;
  void *pvVar9;
  ulong uVar10;
  float *pfVar11;
  void *pvVar12;
  ulong uVar13;
  ulong uVar14;
  float *pfVar15;
  ulong uVar16;
  uint uVar17;
  float fVar18;
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  void *ptr;
  void *local_80;
  void *local_78;
  int *piStack_70;
  size_t local_68;
  undefined4 local_60;
  Allocator *local_58;
  undefined4 local_50;
  uint local_4c;
  undefined8 local_48;
  long local_40;
  size_t local_38;
  
  iVar8 = bottom_blob->w;
  iVar2 = bottom_blob->h;
  _c = bottom_blob->c;
  uVar10 = (ulong)_c;
  local_38 = bottom_blob->elemsize;
  Mat::create(top_blob,iVar8,iVar2,_c,local_38,opt->blob_allocator);
  pvVar9 = top_blob->data;
  if (pvVar9 == (void *)0x0) {
    return -100;
  }
  sVar3 = top_blob->cstep;
  if ((long)top_blob->c * sVar3 == 0) {
    return -100;
  }
  uVar17 = iVar2 * iVar8;
  iVar8 = this->across_spatial;
  iVar2 = this->across_channel;
  if (iVar2 == 0 || iVar8 == 0) {
    if (iVar8 != 0 && iVar2 == 0) {
      if ((int)_c < 1) {
        return 0;
      }
      pvVar12 = bottom_blob->data;
      sVar4 = bottom_blob->cstep;
      iVar8 = this->channel_shared;
      sVar5 = bottom_blob->elemsize;
      sVar6 = top_blob->elemsize;
      uVar14 = 0;
      do {
        if (0 < (int)uVar17) {
          fVar19 = this->eps;
          uVar16 = 0;
          do {
            fVar18 = *(float *)((long)pvVar12 + uVar16 * 4);
            fVar19 = fVar19 + fVar18 * fVar18;
            uVar16 = uVar16 + 1;
          } while (uVar17 != uVar16);
          if (0 < (int)uVar17) {
            auVar20 = rsqrtss(ZEXT816(0),ZEXT416((uint)fVar19));
            fVar18 = auVar20._0_4_;
            uVar16 = 0;
            if (iVar8 == 0) {
              uVar16 = uVar14;
            }
            fVar1 = *(float *)((long)(this->scale_data).data + uVar16 * 4);
            uVar16 = 0;
            do {
              *(float *)((long)pvVar9 + uVar16 * 4) =
                   *(float *)((long)pvVar12 + uVar16 * 4) * fVar1 *
                   fVar18 * -0.5 * (fVar19 * fVar18 * fVar18 + -3.0);
              uVar16 = uVar16 + 1;
            } while (uVar17 != uVar16);
          }
        }
        uVar14 = uVar14 + 1;
        pvVar12 = (void *)((long)pvVar12 + sVar4 * sVar5);
        pvVar9 = (void *)((long)pvVar9 + sVar3 * sVar6);
      } while (uVar14 != uVar10);
      return 0;
    }
    if (iVar2 == 0 || iVar8 != 0) {
      return 0;
    }
    local_58 = opt->workspace_allocator;
    local_78 = (void *)0x0;
    piStack_70 = (int *)0x0;
    local_68 = local_38;
    local_60 = 1;
    local_50 = 1;
    local_48 = 0x100000001;
    local_40 = (long)(int)uVar17;
    if (uVar17 == 0) {
      return -100;
    }
    uVar14 = local_38 * local_40 + 3 & 0xfffffffffffffffc;
    local_4c = uVar17;
    if (local_58 == (Allocator *)0x0) {
      local_80 = (void *)0x0;
      iVar8 = posix_memalign(&local_80,0x10,uVar14 + 4);
      local_78 = (void *)0x0;
      if (iVar8 == 0) {
        local_78 = local_80;
      }
    }
    else {
      local_78 = (void *)(**(code **)(*(long *)local_58 + 0x10))(local_58,uVar14 + 4);
    }
    piStack_70 = (int *)((long)local_78 + uVar14);
    *(undefined4 *)((long)local_78 + uVar14) = 1;
    if (this->channel_shared == 0) {
      if (0 < (int)uVar17) {
        pfVar11 = (float *)bottom_blob->data;
        sVar3 = bottom_blob->cstep;
        sVar4 = bottom_blob->elemsize;
        uVar14 = 0;
        do {
          fVar19 = this->eps;
          uVar16 = uVar10;
          pfVar15 = pfVar11;
          if (0 < (int)_c) {
            do {
              fVar19 = fVar19 + *pfVar15 * *pfVar15;
              pfVar15 = (float *)((long)pfVar15 + sVar3 * sVar4);
              uVar16 = uVar16 - 1;
            } while (uVar16 != 0);
          }
          auVar20 = rsqrtss(ZEXT816(0),ZEXT416((uint)fVar19));
          fVar18 = auVar20._0_4_;
          *(float *)((long)local_78 + uVar14 * 4) =
               fVar18 * -0.5 * (fVar19 * fVar18 * fVar18 + -3.0);
          uVar14 = uVar14 + 1;
          pfVar11 = pfVar11 + 1;
        } while (uVar14 != uVar17);
      }
      if (0 < (int)_c) {
        pvVar9 = bottom_blob->data;
        sVar3 = bottom_blob->cstep;
        pvVar12 = top_blob->data;
        sVar4 = top_blob->cstep;
        sVar5 = top_blob->elemsize;
        pvVar7 = (this->scale_data).data;
        sVar6 = bottom_blob->elemsize;
        uVar14 = 0;
        do {
          if (0 < (int)uVar17) {
            fVar19 = *(float *)((long)pvVar7 + uVar14 * 4);
            uVar16 = 0;
            do {
              *(float *)((long)pvVar12 + uVar16 * 4) =
                   *(float *)((long)pvVar9 + uVar16 * 4) * fVar19 *
                   *(float *)((long)local_78 + uVar16 * 4);
              uVar16 = uVar16 + 1;
            } while (uVar17 != uVar16);
          }
          uVar14 = uVar14 + 1;
          pvVar12 = (void *)((long)pvVar12 + sVar4 * sVar5);
          pvVar9 = (void *)((long)pvVar9 + sVar3 * sVar6);
        } while (uVar14 != uVar10);
      }
    }
    else {
      if (0 < (int)uVar17) {
        fVar19 = *(this->scale_data).data;
        pfVar11 = (float *)bottom_blob->data;
        sVar3 = bottom_blob->cstep;
        sVar4 = bottom_blob->elemsize;
        uVar14 = 0;
        do {
          auVar20 = ZEXT416((uint)this->eps);
          uVar16 = uVar10;
          pfVar15 = pfVar11;
          if (0 < (int)_c) {
            do {
              auVar20._0_4_ = auVar20._0_4_ + *pfVar15 * *pfVar15;
              pfVar15 = (float *)((long)pfVar15 + sVar3 * sVar4);
              uVar16 = uVar16 - 1;
            } while (uVar16 != 0);
          }
          auVar21 = rsqrtss(ZEXT816(0),auVar20);
          fVar18 = auVar21._0_4_;
          *(float *)((long)local_78 + uVar14 * 4) =
               fVar18 * -0.5 * fVar19 * (auVar20._0_4_ * fVar18 * fVar18 + -3.0);
          uVar14 = uVar14 + 1;
          pfVar11 = pfVar11 + 1;
        } while (uVar14 != uVar17);
      }
      if (0 < (int)_c) {
        pvVar9 = bottom_blob->data;
        sVar3 = bottom_blob->cstep;
        pvVar12 = top_blob->data;
        sVar4 = top_blob->cstep;
        sVar5 = top_blob->elemsize;
        sVar6 = bottom_blob->elemsize;
        uVar14 = 0;
        do {
          if (0 < (int)uVar17) {
            uVar16 = 0;
            do {
              *(float *)((long)pvVar12 + uVar16 * 4) =
                   *(float *)((long)local_78 + uVar16 * 4) * *(float *)((long)pvVar9 + uVar16 * 4);
              uVar16 = uVar16 + 1;
            } while (uVar17 != uVar16);
          }
          uVar14 = uVar14 + 1;
          pvVar12 = (void *)((long)pvVar12 + sVar4 * sVar5);
          pvVar9 = (void *)((long)pvVar9 + sVar3 * sVar6);
        } while (uVar14 != uVar10);
      }
    }
    LOCK();
    *piStack_70 = *piStack_70 + -1;
    UNLOCK();
    if (*piStack_70 != 0) {
      return 0;
    }
    if (local_58 != (Allocator *)0x0) {
      (**(code **)(*(long *)local_58 + 0x18))();
      return 0;
    }
  }
  else {
    local_40 = (long)(int)_c;
    local_58 = opt->workspace_allocator;
    local_78 = (void *)0x0;
    piStack_70 = (int *)0x0;
    local_68 = local_38;
    local_60 = 1;
    local_50 = 1;
    local_48 = 0x100000001;
    if (_c == 0) {
      return -100;
    }
    uVar14 = local_38 * local_40 + 3 & 0xfffffffffffffffc;
    local_4c = _c;
    if (local_58 == (Allocator *)0x0) {
      local_80 = (void *)0x0;
      iVar8 = posix_memalign(&local_80,0x10,uVar14 + 4);
      local_78 = (void *)0x0;
      if (iVar8 == 0) {
        local_78 = local_80;
      }
    }
    else {
      local_78 = (void *)(**(code **)(*(long *)local_58 + 0x10))(local_58,uVar14 + 4);
    }
    piStack_70 = (int *)((long)local_78 + uVar14);
    *(undefined4 *)((long)local_78 + uVar14) = 1;
    uVar14 = (ulong)uVar17;
    if ((int)_c < 1) {
      fVar19 = this->eps;
    }
    else {
      pvVar9 = bottom_blob->data;
      sVar3 = bottom_blob->cstep;
      sVar4 = bottom_blob->elemsize;
      uVar16 = 0;
      do {
        fVar19 = 0.0;
        if (0 < (int)uVar17) {
          uVar13 = 0;
          do {
            fVar18 = *(float *)((long)pvVar9 + uVar13 * 4);
            fVar19 = fVar19 + fVar18 * fVar18;
            uVar13 = uVar13 + 1;
          } while (uVar14 != uVar13);
        }
        *(float *)((long)local_78 + uVar16 * 4) = fVar19;
        uVar16 = uVar16 + 1;
        pvVar9 = (void *)((long)pvVar9 + sVar3 * sVar4);
      } while (uVar16 != uVar10);
      fVar19 = this->eps;
      if (0 < (int)_c) {
        uVar16 = 0;
        do {
          fVar19 = fVar19 + *(float *)((long)local_78 + uVar16 * 4);
          uVar16 = uVar16 + 1;
        } while (uVar10 != uVar16);
      }
    }
    auVar20 = rsqrtss(ZEXT816(0),ZEXT416((uint)fVar19));
    fVar18 = auVar20._0_4_;
    fVar19 = fVar18 * -0.5 * (fVar19 * fVar18 * fVar18 + -3.0);
    if (this->channel_shared == 0) {
      if (0 < (int)_c) {
        pvVar9 = bottom_blob->data;
        sVar3 = bottom_blob->cstep;
        pvVar12 = top_blob->data;
        sVar4 = top_blob->cstep;
        sVar5 = top_blob->elemsize;
        pvVar7 = (this->scale_data).data;
        sVar6 = bottom_blob->elemsize;
        uVar16 = 0;
        do {
          if (0 < (int)uVar17) {
            fVar18 = *(float *)((long)pvVar7 + uVar16 * 4);
            uVar13 = 0;
            do {
              *(float *)((long)pvVar12 + uVar13 * 4) =
                   *(float *)((long)pvVar9 + uVar13 * 4) * fVar18 * fVar19;
              uVar13 = uVar13 + 1;
            } while (uVar14 != uVar13);
          }
          uVar16 = uVar16 + 1;
          pvVar12 = (void *)((long)pvVar12 + sVar4 * sVar5);
          pvVar9 = (void *)((long)pvVar9 + sVar3 * sVar6);
        } while (uVar16 != uVar10);
      }
    }
    else if (0 < (int)_c) {
      fVar18 = *(this->scale_data).data;
      pvVar9 = bottom_blob->data;
      sVar3 = bottom_blob->cstep;
      sVar4 = top_blob->cstep;
      sVar5 = top_blob->elemsize;
      pvVar12 = top_blob->data;
      sVar6 = bottom_blob->elemsize;
      uVar16 = 0;
      do {
        if (0 < (int)uVar17) {
          uVar13 = 0;
          do {
            *(float *)((long)pvVar12 + uVar13 * 4) =
                 *(float *)((long)pvVar9 + uVar13 * 4) * fVar19 * fVar18;
            uVar13 = uVar13 + 1;
          } while (uVar14 != uVar13);
        }
        uVar16 = uVar16 + 1;
        pvVar12 = (void *)((long)pvVar12 + sVar4 * sVar5);
        pvVar9 = (void *)((long)pvVar9 + sVar3 * sVar6);
      } while (uVar16 != uVar10);
    }
    LOCK();
    *piStack_70 = *piStack_70 + -1;
    UNLOCK();
    if (*piStack_70 != 0) {
      return 0;
    }
    if (local_58 != (Allocator *)0x0) {
      (**(code **)(*(long *)local_58 + 0x18))();
      return 0;
    }
  }
  if (local_78 != (void *)0x0) {
    free(local_78);
  }
  return 0;
}

Assistant:

int Normalize::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int size = w * h;

    top_blob.create(w, h, channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (across_spatial && across_channel)
    {
        // square
        Mat square_sum_blob;
        square_sum_blob.create(channels, elemsize, opt.workspace_allocator);
        if (square_sum_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);

            float ssum = 0.f;
            for (int i=0; i<size; i++)
            {
                ssum += ptr[i] * ptr[i];
            }

            square_sum_blob[q] = ssum;
        }

        // sum + eps
        float ssum = eps;
        for (int q=0; q<channels; q++)
        {
            ssum += square_sum_blob[q];
        }

        // 1 / sqrt(ssum)
        float a = 1.f / sqrt(ssum);

        if (channel_shared)
        {
            float scale = a * scale_data[0];

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i=0; i<size; i++)
                {
                    outptr[i] = ptr[i] * scale;
                }
            }
        }
        else
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);
                float scale = a * scale_data[q];

                for (int i=0; i<size; i++)
                {
                    outptr[i] = ptr[i] * scale;
                }
            }
        }

        return 0;
    }

    if (across_spatial && !across_channel)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            float ssum = eps;
            for (int i=0; i<size; i++)
            {
                ssum += ptr[i] * ptr[i];
            }

            float a = 1.f / sqrt(ssum);
            float scale = a * (channel_shared ? scale_data[0] : scale_data[q]);

            for (int i=0; i<size; i++)
            {
                outptr[i] = ptr[i] * scale;
            }
        }

        return 0;
    }

    if (!across_spatial && across_channel)
    {
        // square sum, 1 / sqrt(ssum)
        Mat square_sum_blob;
        square_sum_blob.create(size, elemsize, opt.workspace_allocator);
        if (square_sum_blob.empty())
            return -100;

        if (channel_shared)
        {
            float scale = scale_data[0];

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i=0; i<size; i++)
            {
                float ssum = eps;
                for (int q=0; q<channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);
                    ssum += ptr[i] * ptr[i];
                }

                square_sum_blob[i] = 1.f / sqrt(ssum) * scale;
            }

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i=0; i<size; i++)
                {
                    outptr[i] = ptr[i] * square_sum_blob[i];
                }
            }
        }
        else
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i=0; i<size; i++)
            {
                float ssum = eps;
                for (int q=0; q<channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);
                    ssum += ptr[i] * ptr[i];
                }

                square_sum_blob[i] = 1.f / sqrt(ssum);
            }

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);
                float scale = scale_data[q];

                for (int i=0; i<size; i++)
                {
                    outptr[i] = ptr[i] * square_sum_blob[i] * scale;
                }
            }
        }

        return 0;
    }

    return 0;
}